

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser15.cpp
# Opt level: O2

void __thiscall COLLADASaxFWL::RootParser15::begin__geometry(RootParser15 *this)

{
  geometry__AttributeData *in_RSI;
  
  begin__geometry((RootParser15 *)&this[-1].super_ExtraDataLoader,in_RSI);
  return;
}

Assistant:

bool RootParser15::begin__geometry( const COLLADASaxFWL15::geometry__AttributeData& attributeData )
    {
        SaxVirtualFunctionTest15(begin__geometry(attributeData));
		GeometryLoader* geometryLoader = beginCommonWithId<GeometryLoader, GeometryLoader15>(attributeData.id);
		if ( attributeData.name )
			geometryLoader->setGeometryName (attributeData.name);
		if ( attributeData.id )
			geometryLoader->setGeometryId (attributeData.id);
        return true;
    }